

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::~VersionSet(VersionSet *this)

{
  long lVar1;
  Writer *this_00;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Version::Unref(this->current_);
  if ((this->dummy_versions_).next_ != &this->dummy_versions_) {
    __assert_fail("dummy_versions_.next_ == &dummy_versions_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x2f4,"leveldb::VersionSet::~VersionSet()");
  }
  this_00 = this->descriptor_log_;
  if (this_00 != (Writer *)0x0) {
    log::Writer::~Writer(this_00);
  }
  operator_delete(this_00,0x20);
  if (this->descriptor_file_ != (WritableFile *)0x0) {
    (*this->descriptor_file_->_vptr_WritableFile[1])();
  }
  lVar2 = 0;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&this->compact_pointer_[6]._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0xe0);
  Version::~Version(&this->dummy_versions_);
  Comparator::~Comparator(&(this->icmp_).super_Comparator);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::~string((string *)&this->dbname_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionSet::~VersionSet() {
  current_->Unref();
  assert(dummy_versions_.next_ == &dummy_versions_);  // List must be empty
  delete descriptor_log_;
  delete descriptor_file_;
}